

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# species.cpp
# Opt level: O0

ostream * IO::operator<<(ostream *output,Species *species)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  _Self local_30;
  _Base_ptr local_28;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
  local_20;
  const_iterator iter;
  Species *species_local;
  ostream *output_local;
  
  iter._M_node = (_Base_ptr)species;
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
  ::_Rb_tree_const_iterator(&local_20);
  poVar2 = std::operator<<(output,"(\n");
  poVar2 = std::operator<<(poVar2,"    Species: \n");
  poVar2 = std::operator<<(poVar2,"    (\n");
  poVar2 = std::operator<<(poVar2,"        Name      : \"");
  poVar2 = std::operator<<(poVar2,(string *)iter._M_node);
  std::operator<<(poVar2,"\"\n");
  local_28 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                      *)&iter._M_node[9]._M_right);
  local_20._M_node = local_28;
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                *)&iter._M_node[9]._M_right);
    bVar1 = std::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    poVar2 = std::operator<<(output,"        Element : ");
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
             ::operator->(&local_20);
    poVar2 = std::operator<<(poVar2,(string *)ppVar3);
    poVar2 = std::operator<<(poVar2," | Number : ");
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
             ::operator->(&local_20);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,ppVar3->second);
    std::operator<<(poVar2,"\n");
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
    ::operator++(&local_20);
  }
  poVar2 = std::operator<<(output,"        Mol. Mass : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(double *)(iter._M_node + 1));
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"    )\n");
  poVar2 = operator<<(poVar2,(Transport *)&iter._M_node[1]._M_parent);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = operator<<(poVar2,(Thermo *)(iter._M_node + 3));
  poVar2 = std::operator<<(poVar2,"\n");
  std::operator<<(poVar2,")");
  return output;
}

Assistant:

ostream& operator<<(ostream& output, const Species& species)
    {
        map<string,double>::const_iterator iter;

        output << "(\n"
               << "    Species: \n"
               << "    (\n"
               << "        Name      : \"" << species.name_ << "\"\n";
        for (iter = species.speciesComposition_.begin(); iter != species.speciesComposition_.end(); ++iter)
                {
        output << "        Element : " << iter->first << " | Number : " << iter->second << "\n";
        }
        output << "        Mol. Mass : " << species.molecularWeight_ << "\n"
               << "    )\n"
               << species.transport_ << "\n"
               << species.thermo_ << "\n"
               << ")";
        return output;
    }